

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asterism_connector_tcp.c
# Opt level: O0

int asterism_connector_tcp_init(asterism_s *as,char *host,uint port)

{
  int iVar1;
  asterism_stream_t *stream;
  as_close p_Var2;
  asterism_tcp_connector_s *connector;
  int ret;
  uint port_local;
  char *host_local;
  asterism_s *as_local;
  
  stream = (asterism_stream_t *)malloc(0x1230);
  memset(stream,0,0x1230);
  p_Var2 = (as_close)as_strdup(host);
  stream[1].close = p_Var2;
  *(uint *)&stream[1].socket.data = port;
  iVar1 = asterism_stream_connect
                    (as,host,port,1,1,connector_connect_cb,(uv_alloc_cb)0x0,connector_read_cb,
                     connector_close_cb,stream);
  if (iVar1 != 0) {
    asterism_stream_close((uv_handle_t *)&stream->socket);
  }
  return iVar1;
}

Assistant:

int asterism_connector_tcp_init(struct asterism_s *as,
                                const char *host, unsigned int port)
{
    int ret = 0;
    struct asterism_tcp_connector_s *connector = AS_ZMALLOC(struct asterism_tcp_connector_s);
    connector->host = as_strdup(host);
    connector->port = port;
    ret = asterism_stream_connect(as, host, port, 1, 1,
                                  connector_connect_cb, 0, connector_read_cb, connector_close_cb, (struct asterism_stream_s *)connector);
    if (ret)
        goto cleanup;
cleanup:
    if (ret)
    {
        asterism_stream_close((uv_handle_t *)&connector->socket);
    }
    return ret;
}